

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<char,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  char cVar1;
  uint32_t len;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar2;
  value_type vVar3;
  uint uVar4;
  int iVar5;
  internal_node<char,_false> *piVar6;
  const_reference pvVar7;
  leaf_node<char,_false> *plVar8;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_b0;
  uint local_a8;
  uint local_a4;
  uint32_t k_1;
  uint32_t k;
  ref<immutable::rrb_details::internal_node<char,_false>_> old_node_1;
  uint32_t cur_size_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_node_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> old_1;
  uint32_t new_size_1;
  uint32_t i_1;
  uint32_t j_1;
  uint32_t j;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_node;
  uint32_t cur_size;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_48;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old;
  uint local_38;
  uint32_t new_size;
  uint32_t i;
  uint32_t offset;
  uint32_t idx;
  uint32_t shift_local;
  uint32_t slen_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *all_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *new_all;
  
  piVar6 = internal_node_create<char,false>(slen);
  ref<immutable::rrb_details::internal_node<char,_false>_>::ref
            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,piVar6);
  i = 0;
  new_size = 0;
  if (shift == 6) {
    for (local_38 = 0; local_38 < slen; local_38 = local_38 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (node_size,(ulong)local_38);
      old.ptr._4_4_ = *pvVar7;
      piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(all);
      ref<immutable::rrb_details::leaf_node<char,false>>::
      ref<immutable::rrb_details::internal_node<char,false>>
                ((ref<immutable::rrb_details::leaf_node<char,false>> *)&local_48,piVar6->child + i);
      vVar3 = old.ptr._4_4_;
      if ((new_size == 0) &&
         (plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_48),
         vVar3 == plVar8->len)) {
        i = i + 1;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)
                   (piVar6->child + local_38),&local_48);
      }
      else {
        plVar8 = leaf_node_create<char,false>(old.ptr._4_4_);
        ref<immutable::rrb_details::leaf_node<char,_false>_>::ref
                  ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&stack0xffffffffffffffa0,
                   plVar8);
        old_node.ptr._4_4_ = 0;
        while (old_node.ptr._4_4_ < old.ptr._4_4_) {
          piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(all);
          ref<immutable::rrb_details::leaf_node<char,false>>::
          ref<immutable::rrb_details::internal_node<char,false>>
                    ((ref<immutable::rrb_details::leaf_node<char,false>> *)&j_1,piVar6->child + i);
          uVar4 = old.ptr._4_4_ - old_node.ptr._4_4_;
          plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&j_1);
          if (uVar4 < plVar8->len - new_size) {
            for (new_size_1 = 0; new_size_1 < old.ptr._4_4_ - old_node.ptr._4_4_;
                new_size_1 = new_size_1 + 1) {
              plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&j_1);
              cVar1 = plVar8->child[new_size + new_size_1];
              plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)
                                  &stack0xffffffffffffffa0);
              plVar8->child[old_node.ptr._4_4_ + new_size_1] = cVar1;
            }
            new_size = (old.ptr._4_4_ - old_node.ptr._4_4_) + new_size;
            old_node.ptr._4_4_ = old.ptr._4_4_;
          }
          else {
            for (i_1 = 0; plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                             ((ref<immutable::rrb_details::leaf_node<char,_false>_>
                                               *)&j_1), i_1 < plVar8->len - new_size; i_1 = i_1 + 1)
            {
              plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&j_1);
              cVar1 = plVar8->child[new_size + i_1];
              plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)
                                  &stack0xffffffffffffffa0);
              plVar8->child[old_node.ptr._4_4_ + i_1] = cVar1;
            }
            plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                               ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&j_1);
            old_node.ptr._4_4_ = (plVar8->len - new_size) + old_node.ptr._4_4_;
            i = i + 1;
            new_size = 0;
          }
          ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&j_1);
        }
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)
                   (piVar6->child + local_38),
                   (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&stack0xffffffffffffffa0)
        ;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&stack0xffffffffffffffa0)
        ;
      }
      ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_48);
    }
  }
  else {
    for (old_1.ptr._4_4_ = 0; old_1.ptr._4_4_ < slen; old_1.ptr._4_4_ = old_1.ptr._4_4_ + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (node_size,(ulong)old_1.ptr._4_4_);
      len = *pvVar7;
      piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(all);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&new_node_1,piVar6->child + i);
      if ((new_size == 0) &&
         (piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&new_node_1)
         , len == piVar6->len)) {
        i = i + 1;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (piVar6->child + old_1.ptr._4_4_,&new_node_1);
      }
      else {
        piVar6 = internal_node_create<char,false>(len);
        ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff70,piVar6);
        old_node_1.ptr._4_4_ = 0;
        while (old_node_1.ptr._4_4_ < len) {
          piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(all);
          ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1,
                     piVar6->child + i);
          uVar4 = len - old_node_1.ptr._4_4_;
          piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1);
          if (uVar4 < piVar6->len - new_size) {
            for (local_a8 = 0; local_a8 < len - old_node_1.ptr._4_4_; local_a8 = local_a8 + 1) {
              piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1);
              prVar2 = piVar6->child;
              uVar4 = new_size + local_a8;
              piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                  &stack0xffffffffffffff70);
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        (piVar6->child + (old_node_1.ptr._4_4_ + local_a8),prVar2 + uVar4);
            }
            new_size = (len - old_node_1.ptr._4_4_) + new_size;
            old_node_1.ptr._4_4_ = len;
          }
          else {
            for (local_a4 = 0; uVar4 = local_a4,
                piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                   ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1
                                   ), uVar4 < piVar6->len - new_size; local_a4 = local_a4 + 1) {
              piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1);
              prVar2 = piVar6->child;
              uVar4 = new_size + local_a4;
              piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                  &stack0xffffffffffffff70);
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        (piVar6->child + (old_node_1.ptr._4_4_ + local_a4),prVar2 + uVar4);
            }
            piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                               ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1);
            iVar5 = piVar6->len - new_size;
            i = i + 1;
            new_size = 0;
            old_node_1.ptr._4_4_ = iVar5 + old_node_1.ptr._4_4_;
          }
          ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&k_1);
        }
        set_sizes<char,false,6>
                  ((rrb_details *)&local_b0,
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff70,shift - 6);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_b0);
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (piVar6->child + old_1.ptr._4_4_,
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff70);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff70);
      }
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&new_node_1);
    }
  }
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)
         (internal_node<char,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }